

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-vec.c
# Opt level: O2

void tcg_gen_dup32i_vec_ppc(TCGContext_conflict9 *tcg_ctx,TCGv_vec r,uint32_t a)

{
  TCGArg in_RCX;
  
  do_dupi_vec(tcg_ctx,r,a,in_RCX);
  return;
}

Assistant:

void tcg_gen_dup32i_vec(TCGContext *tcg_ctx, TCGv_vec r, uint32_t a)
{
    do_dupi_vec(tcg_ctx, r, MO_REG, dup_const(MO_32, a));
}